

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O3

transformations_t *
opengv::absolute_pose::p3p_gao
          (transformations_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,size_t index0,
          size_t index1,size_t index2)

{
  points_t p;
  bearingVectors_t f;
  Matrix<double,_3,_1,_0,_3,_1> local_78;
  bearingVectors_t local_58;
  Matrix<double,_3,_1,_0,_3,_1> local_40;
  
  local_58.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_58.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_78);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_58,(iterator)0x0,&local_78);
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_78,adapter,index1);
  if (local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_58,
               (iterator)
               local_58.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_78);
  }
  else {
    ((local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    ((local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    ((local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_58.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_78,adapter,index2);
  if (local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_58,
               (iterator)
               local_58.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_78);
  }
  else {
    ((local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    ((local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    ((local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_58.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.0;
  local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       0.0;
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_40,adapter,index0);
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_78,(iterator)0x0,&local_40);
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_40,adapter,index1);
  if (local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] == local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2]) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_78,
               (iterator)
               local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1],&local_40);
  }
  else {
    (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
     local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
     )->m_storage).m_data.array[2] =
         local_40.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
     local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
     )->m_storage).m_data.array[0] =
         local_40.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
     local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
     )->m_storage).m_data.array[1] =
         local_40.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1] + 0x18);
  }
  (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_40,adapter,index2);
  if (local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] == local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array[2]) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_78,
               (iterator)
               local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[1],&local_40);
  }
  else {
    (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
     local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
     )->m_storage).m_data.array[2] =
         local_40.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[2];
    (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
     local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
     )->m_storage).m_data.array[0] =
         local_40.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[0];
    (((PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
     local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
     )->m_storage).m_data.array[1] =
         local_40.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
         array[1];
    local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
         = (double)((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1] + 0x18);
  }
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_3,_4,_0,_3,_4>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  modules::p3p_gao_main(&local_58,(points_t *)&local_78,__return_storage_ptr__);
  if (local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] != 0.0) {
    free(*(void **)((long)local_78.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0] + -8));
  }
  if (local_58.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_58.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  return __return_storage_ptr__;
}

Assistant:

opengv::transformations_t
opengv::absolute_pose::p3p_gao(
    const AbsoluteAdapterBase & adapter,
    size_t index0,
    size_t index1,
    size_t index2)
{
  bearingVectors_t f;
  f.push_back(adapter.getBearingVector(index0));
  f.push_back(adapter.getBearingVector(index1));
  f.push_back(adapter.getBearingVector(index2));
  points_t p;
  p.push_back(adapter.getPoint(index0));
  p.push_back(adapter.getPoint(index1));
  p.push_back(adapter.getPoint(index2));
  transformations_t solutions;
  modules::p3p_gao_main( f, p, solutions );
  return solutions;
}